

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

bool __thiscall
SmallArray<unsigned_char,_16U>::contains(SmallArray<unsigned_char,_16U> *this,uchar *val)

{
  uint local_24;
  uint i;
  uchar *val_local;
  SmallArray<unsigned_char,_16U> *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->count <= local_24) {
      return false;
    }
    if (this->data[local_24] == *val) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool contains(const T& val) const
	{
		for(unsigned i = 0; i < count; i++)
		{
			if(data[i] == val)
				return true;
		}

		return false;
	}